

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O2

bool __thiscall RevocationEntry::Decode(RevocationEntry *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_00;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  size_t cbIn_00;
  byte bVar6;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  sh.prefixSize = 0;
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    if (pIn[sh.dataSize + lVar1] == '\x02') {
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      cbUsed_00 = &sh.prefixSize;
      bVar3 = Integer::Decode(&this->userCertificate,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
      sVar2 = sh.dataSize;
      if (bVar3) {
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
        lVar1 = *(long *)sh.cbCurrent;
        sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar3 = Time::Decode(&this->revocationDate,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
        sVar2 = sh.dataSize;
        if (bVar3) {
          *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
          sh.prefixSize = 0;
          sVar5 = *(size_t *)sh.cbCurrent;
          bVar6 = 1;
          if ((undefined1  [8])sVar5 != auStack_58) {
            cbIn_00 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
            bVar6 = Extensions::Decode(&this->crlEntryExtensions,pIn + sVar2 + sVar5,cbIn_00,
                                       cbUsed_00);
          }
          goto LAB_0011ae1c;
        }
      }
    }
    else {
      *cbUsed = 0;
      auStack_58 = (undefined1  [8])0x0;
      sh.dataSize = 0;
      sh.prefixSize = 0;
    }
    bVar6 = 0;
  }
LAB_0011ae1c:
  SequenceHelper::~SequenceHelper((SequenceHelper *)auStack_58);
  return (bool)(bVar6 & 1);
}

Assistant:

bool RevocationEntry::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    // We have an optional sequence of RevocationEntry object
    // and won't know if there really is a RevocationEntry until
    // we get here
    if ( *sh.DataPtr(pIn) != static_cast<unsigned char>(DerType::Integer) )
    {
        cbUsed = 0;
        sh.Reset(); // This keeps us from throwing
        return false;
    }

    if (!userCertificate.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!revocationDate.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    
    if (sh.IsAllUsed()) // crlEntryExtensions are optional
        return true;

    if (!crlEntryExtensions.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    return true;
}